

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# std_constr.cc
# Opt level: O1

void mp::WriteModelItem(MemoryWriter *wrt,LinTerms *lt,ItemNamer *vnam)

{
  char *pcVar1;
  size_t sVar2;
  size_t __n;
  ptrdiff_t _Num;
  Buffer<char> *pBVar3;
  size_t sVar4;
  ulong uVar5;
  char *str;
  char *pcVar6;
  long lVar7;
  double dVar8;
  FormatSpec local_48;
  
  if (0 < (int)(lt->coefs_).super_small_vector_base<std::allocator<double>,_6U>.m_data.
               super_small_vector_data_base<double_*,_unsigned_long>.m_size) {
    lVar7 = 0;
    do {
      dVar8 = (lt->coefs_).super_small_vector_base<std::allocator<double>,_6U>.m_data.
              super_small_vector_data_base<double_*,_unsigned_long>.m_data_ptr[lVar7];
      if (lVar7 == 0) {
        if (dVar8 < 0.0) {
          pBVar3 = (wrt->super_BasicWriter<char>).buffer_;
          sVar4 = pBVar3->size_ + 1;
          if (pBVar3->capacity_ < sVar4) {
            (**pBVar3->_vptr_Buffer)(pBVar3,sVar4);
          }
          pBVar3->ptr_[pBVar3->size_] = '-';
          goto LAB_003518b1;
        }
      }
      else {
        pcVar6 = " - ";
        if (0.0 <= dVar8) {
          pcVar6 = " + ";
        }
        pBVar3 = (wrt->super_BasicWriter<char>).buffer_;
        sVar4 = pBVar3->size_ + 3;
        if (pBVar3->capacity_ < sVar4) {
          (**pBVar3->_vptr_Buffer)(pBVar3,sVar4);
        }
        pcVar1 = pBVar3->ptr_;
        sVar2 = pBVar3->size_;
        pcVar1[sVar2 + 2] = pcVar6[2];
        *(undefined2 *)(pcVar1 + sVar2) = *(undefined2 *)pcVar6;
LAB_003518b1:
        pBVar3->size_ = sVar4;
      }
      dVar8 = ABS(dVar8);
      if ((dVar8 != 1.0) || (NAN(dVar8))) {
        local_48.super_AlignSpec.super_WidthSpec.width_ = 0;
        local_48.super_AlignSpec.super_WidthSpec.fill_ = L' ';
        local_48.super_AlignSpec.align_ = ALIGN_DEFAULT;
        local_48.flags_ = 0;
        local_48.precision_ = -1;
        local_48.type_ = '\0';
        fmt::BasicWriter<char>::write_double<double>(&wrt->super_BasicWriter<char>,dVar8,&local_48);
        pBVar3 = (wrt->super_BasicWriter<char>).buffer_;
        if (pBVar3->size_ == pBVar3->capacity_) {
          (**pBVar3->_vptr_Buffer)(pBVar3,pBVar3->size_ + 1);
        }
        sVar4 = pBVar3->size_;
        pBVar3->size_ = sVar4 + 1;
        pBVar3->ptr_[sVar4] = '*';
      }
      pcVar6 = ItemNamer::at(vnam,(long)(lt->vars_).super_small_vector_base<std::allocator<int>,_6U>
                                        .m_data.super_small_vector_data_base<int_*,_unsigned_long>.
                                        m_data_ptr[lVar7]);
      __n = strlen(pcVar6);
      pBVar3 = (wrt->super_BasicWriter<char>).buffer_;
      uVar5 = pBVar3->size_ + __n;
      if (pBVar3->capacity_ < uVar5) {
        (**pBVar3->_vptr_Buffer)(pBVar3,uVar5);
      }
      if (__n != 0) {
        memmove(pBVar3->ptr_ + pBVar3->size_,pcVar6,__n);
      }
      pBVar3->size_ = uVar5;
      lVar7 = lVar7 + 1;
    } while (lVar7 < (int)(lt->coefs_).super_small_vector_base<std::allocator<double>,_6U>.m_data.
                          super_small_vector_data_base<double_*,_unsigned_long>.m_size);
  }
  return;
}

Assistant:

void WriteModelItem(fmt::MemoryWriter& wrt, const LinTerms& lt,
                    ItemNamer& vnam) {
  for (int i=0; i<(int)lt.size(); ++i) {
    auto coef = lt.coef(i);
    bool ifpos = coef>=0.0;
    if (i) {
      wrt << (ifpos ? " + " : " - ");
    } else {
      if (!ifpos)
        wrt << "-";
    }
    auto abscoef = std::fabs(coef);
    if (1.0 != abscoef)
      wrt << abscoef << '*';
    wrt << vnam.at(lt.var(i));
  }
}